

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::FCDUTF16CollationIterator::nextCodePoint
          (FCDUTF16CollationIterator *this,UErrorCode *errorCode)

{
  UChar UVar1;
  UBool UVar2;
  UChar *pUVar3;
  uint local_24;
  UChar trail;
  UChar32 c;
  UErrorCode *errorCode_local;
  FCDUTF16CollationIterator *this_local;
  
  do {
    if ('\0' < this->checkDir) {
      if ((this->super_UTF16CollationIterator).pos == (this->super_UTF16CollationIterator).limit) {
        this_local._4_4_ = 0xffffffff;
      }
      else {
        pUVar3 = (this->super_UTF16CollationIterator).pos;
        (this->super_UTF16CollationIterator).pos = pUVar3 + 1;
        local_24 = (uint)(ushort)*pUVar3;
        UVar2 = CollationFCD::hasTccc(local_24);
        if (UVar2 == '\0') {
          if ((local_24 == 0) && ((this->super_UTF16CollationIterator).limit == (UChar *)0x0)) {
            pUVar3 = (this->super_UTF16CollationIterator).pos + -1;
            (this->super_UTF16CollationIterator).pos = pUVar3;
            this->rawLimit = pUVar3;
            (this->super_UTF16CollationIterator).limit = pUVar3;
            return -1;
          }
        }
        else {
          UVar2 = CollationFCD::maybeTibetanCompositeVowel(local_24);
          if ((UVar2 != '\0') ||
             (((this->super_UTF16CollationIterator).pos !=
               (this->super_UTF16CollationIterator).limit &&
              (UVar2 = CollationFCD::hasLccc
                                 ((uint)(ushort)*(this->super_UTF16CollationIterator).pos),
              UVar2 != '\0')))) {
            (this->super_UTF16CollationIterator).pos = (this->super_UTF16CollationIterator).pos + -1
            ;
            UVar2 = nextSegment(this,errorCode);
            if (UVar2 == '\0') {
              return -1;
            }
            pUVar3 = (this->super_UTF16CollationIterator).pos;
            (this->super_UTF16CollationIterator).pos = pUVar3 + 1;
            local_24 = (uint)(ushort)*pUVar3;
          }
        }
LAB_0028180f:
        if ((((local_24 & 0xfffffc00) == 0xd800) &&
            ((this->super_UTF16CollationIterator).pos != (this->super_UTF16CollationIterator).limit)
            ) && (UVar1 = *(this->super_UTF16CollationIterator).pos, (UVar1 & 0xfc00U) == 0xdc00)) {
          (this->super_UTF16CollationIterator).pos = (this->super_UTF16CollationIterator).pos + 1;
          this_local._4_4_ = local_24 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
        }
        else {
          this_local._4_4_ = local_24;
        }
      }
      return this_local._4_4_;
    }
    if ((this->checkDir == '\0') &&
       ((this->super_UTF16CollationIterator).pos != (this->super_UTF16CollationIterator).limit)) {
      pUVar3 = (this->super_UTF16CollationIterator).pos;
      (this->super_UTF16CollationIterator).pos = pUVar3 + 1;
      local_24 = (uint)(ushort)*pUVar3;
      goto LAB_0028180f;
    }
    switchToForward(this);
  } while( true );
}

Assistant:

UChar32
FCDUTF16CollationIterator::nextCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(checkDir > 0) {
            if(pos == limit) {
                return U_SENTINEL;
            }
            c = *pos++;
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != limit && CollationFCD::hasLccc(*pos))) {
                    --pos;
                    if(!nextSegment(errorCode)) {
                        return U_SENTINEL;
                    }
                    c = *pos++;
                }
            } else if(c == 0 && limit == NULL) {
                limit = rawLimit = --pos;
                return U_SENTINEL;
            }
            break;
        } else if(checkDir == 0 && pos != limit) {
            c = *pos++;
            break;
        } else {
            switchToForward();
        }
    }
    UChar trail;
    if(U16_IS_LEAD(c) && pos != limit && U16_IS_TRAIL(trail = *pos)) {
        ++pos;
        return U16_GET_SUPPLEMENTARY(c, trail);
    } else {
        return c;
    }
}